

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.h
# Opt level: O2

CScript * __thiscall
CScript::operator<<(CScript *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *b)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  long *last;
  CScript *pCVar4;
  iterator iVar5;
  long in_FS_OFFSET;
  uint8_t _data [2];
  undefined1 local_24 [4];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = (long)(b->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(b->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar2 < 0x4c) {
    uVar1 = (this->super_CScriptBase)._size;
    uVar3 = uVar1 - 0x1d;
    if (uVar1 < 0x1d) {
      uVar3 = uVar1;
    }
    pCVar4 = (CScript *)(this->super_CScriptBase)._union.indirect_contents.indirect;
    if (uVar1 < 0x1d) {
      pCVar4 = this;
    }
    iVar5.ptr = (uchar *)((long)&(pCVar4->super_CScriptBase)._union + (long)(int)uVar3);
    local_24[0] = (char)uVar2;
  }
  else {
    if (0xff < uVar2) {
      uVar1 = (this->super_CScriptBase)._size;
      uVar3 = uVar1 - 0x1d;
      if (uVar1 < 0x1d) {
        uVar3 = uVar1;
      }
      pCVar4 = (CScript *)(this->super_CScriptBase)._union.indirect_contents.indirect;
      if (uVar1 < 0x1d) {
        pCVar4 = this;
      }
      iVar5.ptr = (uchar *)((long)&(pCVar4->super_CScriptBase)._union + (long)(int)uVar3);
      if (uVar2 < 0x10000) {
        local_24[0] = 0x4d;
        prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
                  (&this->super_CScriptBase,iVar5,local_24);
        local_24._0_2_ =
             (short)*(undefined4 *)
                     &(b->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                      .super__Vector_impl_data._M_finish -
             (short)*(undefined4 *)
                     &(b->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                      .super__Vector_impl_data._M_start;
        uVar1 = (this->super_CScriptBase)._size;
        uVar3 = uVar1 - 0x1d;
        if (uVar1 < 0x1d) {
          uVar3 = uVar1;
        }
        pCVar4 = (CScript *)(this->super_CScriptBase)._union.indirect_contents.indirect;
        if (uVar1 < 0x1d) {
          pCVar4 = this;
        }
        iVar5.ptr = (uchar *)((long)&(pCVar4->super_CScriptBase)._union + (long)(int)uVar3);
        last = (long *)(local_24 + 2);
      }
      else {
        local_24[0] = 0x4e;
        prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
                  (&this->super_CScriptBase,iVar5,local_24);
        local_24 = (undefined1  [4])
                   (*(int *)&(b->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                             _M_impl.super__Vector_impl_data._M_finish -
                   *(int *)&(b->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                            _M_impl.super__Vector_impl_data._M_start);
        uVar1 = (this->super_CScriptBase)._size;
        uVar3 = uVar1 - 0x1d;
        if (uVar1 < 0x1d) {
          uVar3 = uVar1;
        }
        pCVar4 = (CScript *)(this->super_CScriptBase)._union.indirect_contents.indirect;
        if (uVar1 < 0x1d) {
          pCVar4 = this;
        }
        iVar5.ptr = (uchar *)((long)&(pCVar4->super_CScriptBase)._union + (long)(int)uVar3);
        last = &local_20;
      }
      prevector<28U,_unsigned_char,_unsigned_int,_int>::insert<unsigned_char_*>
                (&this->super_CScriptBase,iVar5,local_24,(uchar *)last);
      goto LAB_0023bf52;
    }
    uVar1 = (this->super_CScriptBase)._size;
    uVar3 = uVar1 - 0x1d;
    if (uVar1 < 0x1d) {
      uVar3 = uVar1;
    }
    pCVar4 = (CScript *)(this->super_CScriptBase)._union.indirect_contents.indirect;
    if (uVar1 < 0x1d) {
      pCVar4 = this;
    }
    local_24[0] = 'L';
    prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
              (&this->super_CScriptBase,
               (uchar *)((long)&(pCVar4->super_CScriptBase)._union + (long)(int)uVar3),local_24);
    uVar1 = (this->super_CScriptBase)._size;
    uVar3 = uVar1 - 0x1d;
    if (uVar1 < 0x1d) {
      uVar3 = uVar1;
    }
    pCVar4 = (CScript *)(this->super_CScriptBase)._union.indirect_contents.indirect;
    if (uVar1 < 0x1d) {
      pCVar4 = this;
    }
    iVar5.ptr = (uchar *)((long)&(pCVar4->super_CScriptBase)._union + (long)(int)uVar3);
    local_24[0] = (char)*(undefined4 *)
                         &(b->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                          _M_impl.super__Vector_impl_data._M_finish -
                  (char)*(undefined4 *)
                         &(b->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                          _M_impl.super__Vector_impl_data._M_start;
  }
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert(&this->super_CScriptBase,iVar5,local_24);
LAB_0023bf52:
  uVar1 = (this->super_CScriptBase)._size;
  uVar3 = uVar1 - 0x1d;
  if (uVar1 < 0x1d) {
    uVar3 = uVar1;
  }
  pCVar4 = (CScript *)(this->super_CScriptBase)._union.indirect_contents.indirect;
  if (uVar1 < 0x1d) {
    pCVar4 = this;
  }
  prevector<28U,_unsigned_char,_unsigned_int,_int>::
  insert<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            (&this->super_CScriptBase,
             (uchar *)((long)&(pCVar4->super_CScriptBase)._union + (long)(int)uVar3),
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )(b->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )(b->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

CScript& operator<<(const std::vector<unsigned char>& b) LIFETIMEBOUND
    {
        if (b.size() < OP_PUSHDATA1)
        {
            insert(end(), (unsigned char)b.size());
        }
        else if (b.size() <= 0xff)
        {
            insert(end(), OP_PUSHDATA1);
            insert(end(), (unsigned char)b.size());
        }
        else if (b.size() <= 0xffff)
        {
            insert(end(), OP_PUSHDATA2);
            uint8_t _data[2];
            WriteLE16(_data, b.size());
            insert(end(), _data, _data + sizeof(_data));
        }
        else
        {
            insert(end(), OP_PUSHDATA4);
            uint8_t _data[4];
            WriteLE32(_data, b.size());
            insert(end(), _data, _data + sizeof(_data));
        }
        insert(end(), b.begin(), b.end());
        return *this;
    }